

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool google::BoolFromEnv(char *v,bool dflt)

{
  bool bVar1;
  bool dflt_local;
  char *v_local;
  
  bVar1 = anon_unknown_1::GetFromEnv<bool>(v,"bool",dflt);
  return bVar1;
}

Assistant:

bool BoolFromEnv(const char *v, bool dflt) {
  return GetFromEnv(v, "bool", dflt);
}